

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

void __thiscall testing::internal::Mutex::Mutex(Mutex *this)

{
  int iVar1;
  GTestLog local_1c;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/vendor/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x7c2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_mutex_init(&mutex_, NULL)",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    GTestLog::~GTestLog(&local_1c);
  }
  (this->super_MutexBase).has_owner_ = false;
  return;
}

Assistant:

Mutex() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_init(&mutex_, NULL));
    has_owner_ = false;
  }